

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O2

Read<int> __thiscall Omega_h::ternary_each<int>(Omega_h *this,Bytes *cond,Read<int> *a,Read<int> *b)

{
  Alloc *pAVar1;
  Alloc *pAVar2;
  void *extraout_RDX;
  int b_00;
  ulong uVar3;
  size_t sVar4;
  Read<int> RVar5;
  Write<int> c;
  type f;
  allocator local_99;
  Write<int> local_98;
  Write<int> local_88;
  type local_78;
  
  pAVar1 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar3 = pAVar1->size;
  }
  else {
    uVar3 = (ulong)pAVar1 >> 3;
  }
  pAVar2 = (b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    sVar4 = pAVar2->size;
  }
  else {
    sVar4 = (ulong)pAVar2 >> 3;
  }
  if ((int)(uVar3 >> 2) == (int)(sVar4 >> 2)) {
    if (((ulong)pAVar1 & 1) == 0) {
      sVar4 = pAVar1->size;
    }
    else {
      sVar4 = (ulong)pAVar1 >> 3;
    }
    pAVar1 = (cond->write_).shared_alloc_.alloc;
    if (((ulong)pAVar1 & 1) == 0) {
      b_00 = (int)pAVar1->size;
    }
    else {
      b_00 = (int)((ulong)pAVar1 >> 3);
    }
    local_78.width = divide_no_remainder<int>((int)(sVar4 >> 2),b_00);
    pAVar1 = (a->write_).shared_alloc_.alloc;
    if (((ulong)pAVar1 & 1) == 0) {
      sVar4 = pAVar1->size;
    }
    else {
      sVar4 = (ulong)pAVar1 >> 3;
    }
    std::__cxx11::string::string((string *)&local_78,"",&local_99);
    Write<int>::Write(&local_98,(LO)(sVar4 >> 2),(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    Write<int>::Write((Write<int> *)&local_78,&local_98);
    Write<signed_char>::Write(&local_78.cond.write_,&cond->write_);
    Write<int>::Write((Write<int> *)&local_78.a,&a->write_);
    Write<int>::Write((Write<int> *)&local_78.b,&b->write_);
    if (((ulong)local_98.shared_alloc_.alloc & 1) == 0) {
      uVar3 = (local_98.shared_alloc_.alloc)->size;
    }
    else {
      uVar3 = (ulong)local_98.shared_alloc_.alloc >> 3;
    }
    parallel_for<Omega_h::ternary_each<int>(Omega_h::Read<signed_char>,Omega_h::Read<int>,Omega_h::Read<int>)::_lambda(int)_1_>
              ((LO)(uVar3 >> 2),&local_78,"ternary_each");
    Write<int>::Write(&local_88,&local_98);
    Read<int>::Read((Read<signed_char> *)this,&local_88);
    Write<int>::~Write(&local_88);
    ternary_each<int>(Omega_h::Read<signed_char>,Omega_h::Read<int>,Omega_h::Read<int>)::
    {lambda(int)#1}::~Read((_lambda_int__1_ *)&local_78);
    Write<int>::~Write(&local_98);
    RVar5.write_.shared_alloc_.direct_ptr = extraout_RDX;
    RVar5.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<int>)RVar5.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","a.size() == b.size()",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
       ,0x137);
}

Assistant:

Read<T> ternary_each(Bytes cond, Read<T> a, Read<T> b) {
  OMEGA_H_CHECK(a.size() == b.size());
  auto width = divide_no_remainder(a.size(), cond.size());
  Write<T> c(a.size());
  auto f = OMEGA_H_LAMBDA(LO i) { c[i] = cond[i / width] ? a[i] : b[i]; };
  parallel_for(c.size(), f, "ternary_each");
  return c;
}